

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

UntypedActionResultHolderBase * __thiscall
testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
          (UntypedFunctionMockerBase *this,void *untyped_args)

{
  bool bVar1;
  int iVar2;
  CallReaction reaction;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  UntypedActionResultHolderBase *pUVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar7;
  LogSeverity severity;
  bool is_excessive;
  bool found;
  void *untyped_action;
  anon_class_48_6_2149f011 handle_failures;
  ExpectationBase *untyped_expectation;
  stringstream ss;
  stringstream why;
  stringstream loc;
  undefined6 in_stack_fffffffffffffac8;
  undefined1 in_stack_ffffffffffffface;
  char cVar8;
  undefined1 in_stack_fffffffffffffacf;
  long local_528;
  undefined1 local_520 [16];
  bool *local_510;
  bool *local_508;
  ExpectationBase **local_500;
  stringstream *local_4f8;
  ExpectationBase *local_4f0;
  long *local_4e8 [2];
  long local_4d8 [2];
  long *local_4c8;
  long local_4c0;
  long local_4b8;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  ios_base local_448 [264];
  string local_340 [4];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  ExpectationBase *this_00;
  undefined4 extraout_var_00;
  
  if ((this->untyped_expectations_).
      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->untyped_expectations_).
      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    cVar8 = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_528 = 0;
    iVar2 = (*this->_vptr_UntypedFunctionMockerBase[6])
                      (this,untyped_args,&local_528,&stack0xffffffffffffface,&local_4b8,
                       &local_340[0].field_2);
    this_00 = (ExpectationBase *)CONCAT44(extraout_var,iVar2);
    local_4f0 = this_00;
    if (((this_00 == (ExpectationBase *)0x0) || (cVar8 != '\0')) ||
       (bVar1 = LogIsVisible(kInfo), bVar1)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_4b8,"    Function call: ",0x13);
      pcVar3 = Name(this);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)&local_4b8 + (int)*(undefined8 *)(local_4b8 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,pcVar3,sVar4);
      }
      (*this->_vptr_UntypedFunctionMockerBase[7])(this,untyped_args,&local_4b8);
      if ((this_00 != (ExpectationBase *)0x0) && (cVar8 == '\0')) {
        ExpectationBase::DescribeLocationTo(this_00,local_1a8);
      }
      local_510 = (bool *)&stack0xfffffffffffffacf;
      local_508 = (bool *)&stack0xffffffffffffface;
      local_500 = &local_4f0;
      local_520._0_8_ = (stringstream *)&local_4c8;
      local_520._8_8_ = local_340;
      local_4f8 = local_1b8;
      if (local_528 == 0) {
        std::__cxx11::stringbuf::str();
        iVar2 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,local_4e8);
        pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_01,iVar2);
        if (local_4e8[0] != local_4d8) {
          operator_delete(local_4e8[0],local_4d8[0] + 1);
        }
      }
      else {
        iVar2 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,local_528,untyped_args);
        pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_00,iVar2);
      }
      if (pUVar5 != (UntypedActionResultHolderBase *)0x0) {
        (*pUVar5->_vptr_UntypedActionResultHolderBase[2])(pUVar5,&local_4b8);
      }
      UntypedInvokeWith::anon_class_48_6_2149f011::operator()((anon_class_48_6_2149f011 *)local_520)
      ;
    }
    else if (local_528 == 0) {
      local_520._0_8_ = (stringstream *)&local_510;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"");
      iVar2 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,local_520);
      pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_05,iVar2);
      if ((stringstream *)local_520._0_8_ != (stringstream *)&local_510) {
        operator_delete((void *)local_520._0_8_,(ulong)(local_510 + 1));
      }
    }
    else {
      iVar2 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,local_528,untyped_args);
      pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_03,iVar2);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(aiStack_138);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
    goto LAB_0013649f;
  }
  MockObject(this);
  reaction = Mock::GetReactionOnUninterestingCalls
                       ((void *)CONCAT17(in_stack_fffffffffffffacf,
                                         CONCAT16(in_stack_ffffffffffffface,
                                                  in_stack_fffffffffffffac8)));
  if (reaction == kWarn) {
    severity = kWarning;
LAB_001363b7:
    bVar1 = LogIsVisible(severity);
    if (!bVar1) {
      pcVar3 = Name(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_340,pcVar3,(allocator<char> *)local_1b8);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0x166ad3);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_4b8 = *plVar7;
        uStack_4b0 = (undefined4)plVar6[3];
        uStack_4ac = *(undefined4 *)((long)plVar6 + 0x1c);
        local_4c8 = &local_4b8;
      }
      else {
        local_4b8 = *plVar7;
        local_4c8 = (long *)*plVar6;
      }
      local_4c0 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      iVar2 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args);
      if (local_4c8 != &local_4b8) {
        operator_delete(local_4c8,local_4b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340[0]._M_dataplus._M_p == &local_340[0].field_2) {
        return (UntypedActionResultHolderBase *)CONCAT44(extraout_var_04,iVar2);
      }
      operator_delete(local_340[0]._M_dataplus._M_p,local_340[0].field_2._M_allocated_capacity + 1);
      return (UntypedActionResultHolderBase *)CONCAT44(extraout_var_04,iVar2);
    }
  }
  else if (reaction == kAllow) {
    severity = kInfo;
    goto LAB_001363b7;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
  (*this->_vptr_UntypedFunctionMockerBase[5])(this,untyped_args,&local_4b8);
  std::__cxx11::stringbuf::str();
  iVar2 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,local_340);
  pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_02,iVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340[0]._M_dataplus._M_p != &local_340[0].field_2) {
    operator_delete(local_340[0]._M_dataplus._M_p,local_340[0].field_2._M_allocated_capacity + 1);
  }
  if (pUVar5 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar5->_vptr_UntypedActionResultHolderBase[2])(pUVar5,&local_4b8);
  }
  std::__cxx11::stringbuf::str();
  ReportUninterestingCall(reaction,local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340[0]._M_dataplus._M_p != &local_340[0].field_2) {
    operator_delete(local_340[0]._M_dataplus._M_p,local_340[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
LAB_0013649f:
  std::ios_base::~ios_base(local_448);
  return pUVar5;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True if and only if we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
                ? LogIsVisible(kWarning)
                :
                // Otherwise, the user wants this to be an error, and we
                // should always print detailed information in the error.
                true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->UntypedPerformDefaultAction(
          untyped_args, "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(untyped_args, &ss);

    // Calculates the function result.
    UntypedActionResultHolderBase* const result =
        this->UntypedPerformDefaultAction(untyped_args, ss.str());

    // Prints the function result.
    if (result != nullptr) result->PrintAsActionResult(&ss);

    ReportUninterestingCall(reaction, ss.str());
    return result;
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = nullptr;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.

  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(untyped_args, &untyped_action,
                                           &is_excessive, &ss, &why);
  const bool found = untyped_expectation != nullptr;

  // True if and only if we need to print the call's arguments
  // and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return untyped_action == nullptr
               ? this->UntypedPerformDefaultAction(untyped_args, "")
               : this->UntypedPerformAction(untyped_action, untyped_args);
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(untyped_args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  UntypedActionResultHolderBase* result = nullptr;

  auto perform_action = [&] {
    return untyped_action == nullptr
               ? this->UntypedPerformDefaultAction(untyped_args, ss.str())
               : this->UntypedPerformAction(untyped_action, untyped_args);
  };
  auto handle_failures = [&] {
    ss << "\n" << why.str();

    if (!found) {
      // No expectation matches this call - reports a failure.
      Expect(false, nullptr, -1, ss.str());
    } else if (is_excessive) {
      // We had an upper-bound violation and the failure message is in ss.
      Expect(false, untyped_expectation->file(), untyped_expectation->line(),
             ss.str());
    } else {
      // We had an expected call and the matching expectation is
      // described in ss.
      Log(kInfo, loc.str() + ss.str(), 2);
    }
  };
#if GTEST_HAS_EXCEPTIONS
  try {
    result = perform_action();
  } catch (...) {
    handle_failures();
    throw;
  }
#else
  result = perform_action();
#endif

  if (result != nullptr) result->PrintAsActionResult(&ss);
  handle_failures();
  return result;
}